

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturetests.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c633::ktxTexture1WriteKTX2TestBase<unsigned_char,_3U,_32849U>::runTest
          (ktxTexture1WriteKTX2TestBase<unsigned_char,_3U,_32849U> *this,bool writeOrientationMeta,
          bool writeWriterMeta)

{
  bool bVar1;
  undefined4 uVar2;
  long lVar3;
  size_t sVar4;
  undefined8 uVar5;
  AssertHelper *pAVar6;
  byte in_DL;
  byte in_SIL;
  long in_RDI;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  ktx_uint64_t levelOffset;
  ktx_uint32_t level;
  ktx_uint64_t prevOffset;
  ktxLevelIndexEntry *levelIndex;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  ktx_uint32_t *dfd;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  KTX_header2 *header;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  ktxHashListEntry *pWriter;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  ktx_uint32_t kvDataLen;
  ktx_uint8_t *kvData;
  ktxHashList *hl;
  ktx_uint8_t *filePtr;
  ktx_size_t ktxMemFileLen;
  ktx_uint8_t *ktxMemFile;
  ktx_error_code_e result;
  ktxTexture1 *texture;
  char (*in_stack_fffffffffffffc18) [38];
  KTX_header2 *in_stack_fffffffffffffc20;
  texinfo *in_stack_fffffffffffffc28;
  char *in_stack_fffffffffffffc30;
  char *in_stack_fffffffffffffc38;
  int line;
  char *in_stack_fffffffffffffc40;
  char *in_stack_fffffffffffffc48;
  Type type;
  AssertHelper *in_stack_fffffffffffffc50;
  ktxTexture1 *in_stack_fffffffffffffc58;
  TextureWriterTestHelper<unsigned_char,_3U,_32849U> *in_stack_fffffffffffffc60;
  WriterTestHelper<unsigned_char,_3U,_32849U> *in_stack_fffffffffffffc68;
  char *in_stack_fffffffffffffc80;
  char *in_stack_fffffffffffffc88;
  ktx_uint8_t *in_stack_fffffffffffffc90;
  undefined4 in_stack_fffffffffffffc98;
  undefined4 in_stack_fffffffffffffc9c;
  AssertHelper *in_stack_fffffffffffffca0;
  AssertionResult local_300 [2];
  AssertionResult local_2e0 [2];
  undefined4 local_2bc;
  ulong local_2b8;
  AssertionResult local_2b0;
  ulong local_2a0;
  uint local_294;
  ulong local_290;
  long local_288;
  undefined4 local_270;
  int local_26c;
  AssertionResult local_268 [2];
  AssertionResult local_248 [2];
  undefined4 local_228;
  int local_224;
  AssertionResult local_220;
  uint *local_210;
  undefined1 local_1f2;
  undefined1 local_1f1;
  AssertionResult local_1f0 [2];
  undefined4 local_1d0;
  int local_1cc;
  AssertionResult local_1c8;
  void *local_1b8;
  string local_1b0 [40];
  WriterTestHelper<unsigned_char,_3U,_32849U> *local_188;
  undefined1 local_171;
  AssertionResult local_170 [2];
  undefined1 local_14a;
  undefined1 local_149;
  AssertionResult local_148 [2];
  undefined4 local_124;
  AssertionResult local_120 [2];
  undefined4 local_fc;
  AssertionResult local_f8;
  undefined8 local_e8;
  uint local_dc;
  string local_d8 [40];
  undefined8 local_b0;
  undefined1 local_99;
  AssertionResult local_98 [3];
  undefined4 local_64;
  AssertionResult local_60;
  uint local_4c;
  void *local_48;
  AssertHelper *local_40;
  void *local_38;
  undefined1 local_30 [8];
  void *local_28;
  ktx_error_code_e local_1c;
  long local_18;
  byte local_a;
  byte local_9;
  
  local_9 = in_SIL & 1;
  local_a = in_DL & 1;
  local_18 = 0;
  ktxHashList_Create(&local_40);
  local_1c = ktxTexture1_Create(in_RDI + 0x150,1,&local_18);
  local_64 = 0;
  testing::internal::EqHelper::Compare<ktx_error_code_e,_ktx_error_code_e,_nullptr>
            (in_stack_fffffffffffffc38,in_stack_fffffffffffffc30,
             (ktx_error_code_e *)in_stack_fffffffffffffc28,
             (ktx_error_code_e *)in_stack_fffffffffffffc20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_60);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffc50);
    testing::AssertionResult::failure_message((AssertionResult *)0x14fe86);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffc50,(Type)((ulong)in_stack_fffffffffffffc48 >> 0x20),
               in_stack_fffffffffffffc40,(int)((ulong)in_stack_fffffffffffffc38 >> 0x20),
               in_stack_fffffffffffffc30);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffca0,
               (Message *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc20);
    testing::Message::~Message((Message *)0x14fee9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x14ff57);
  local_99 = local_18 != 0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffffc20,(bool *)in_stack_fffffffffffffc18,
             (type *)0x14ff85);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_98);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffc50);
    testing::Message::operator<<
              ((Message *)in_stack_fffffffffffffc20,(char (*) [28])in_stack_fffffffffffffc18);
    local_b0 = ktxErrorString(local_1c);
    testing::Message::operator<<
              ((Message *)in_stack_fffffffffffffc20,(char **)in_stack_fffffffffffffc18);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
               (char *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,in_stack_fffffffffffffc80
              );
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffc50,(Type)((ulong)in_stack_fffffffffffffc48 >> 0x20),
               in_stack_fffffffffffffc40,(int)((ulong)in_stack_fffffffffffffc38 >> 0x20),
               in_stack_fffffffffffffc30);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffca0,
               (Message *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc20);
    std::__cxx11::string::~string(local_d8);
    testing::Message::~Message((Message *)0x1500bb);
  }
  local_dc = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x150168);
  if (local_dc == 0) {
    if ((local_9 & 1) != 0) {
      lVar3 = local_18 + 0x50;
      sVar4 = strlen((char *)(in_RDI + 0x3c));
      ktxHashList_AddKVPair(lVar3,"KTXorientation",(int)sVar4 + 1,in_RDI + 0x3c);
      pAVar6 = local_40;
      sVar4 = strlen((char *)(in_RDI + 0x80));
      ktxHashList_AddKVPair(pAVar6,"KTXorientation",(int)sVar4 + 1,in_RDI + 0x80);
    }
    if ((local_a & 1) != 0) {
      in_stack_fffffffffffffc90 = (ktx_uint8_t *)(local_18 + 0x50);
      in_stack_fffffffffffffc9c = std::__cxx11::string::size();
      uVar5 = std::__cxx11::string::data();
      ktxHashList_AddKVPair(in_stack_fffffffffffffc90,"KTXwriter",in_stack_fffffffffffffc9c,uVar5);
      in_stack_fffffffffffffca0 = local_40;
      uVar2 = std::__cxx11::string::size();
      uVar5 = std::__cxx11::string::data();
      ktxHashList_AddKVPair(in_stack_fffffffffffffca0,"KTXwriter",uVar2,uVar5);
    }
    local_e8 = 0;
    ktxHashList_FindEntry(local_40,"KTXwriter",&local_e8);
    local_1c = appendLibId(local_40,local_e8);
    local_fc = 0;
    testing::internal::EqHelper::Compare<ktx_error_code_e,_ktx_error_code_e,_nullptr>
              (in_stack_fffffffffffffc38,in_stack_fffffffffffffc30,
               (ktx_error_code_e *)in_stack_fffffffffffffc28,
               (ktx_error_code_e *)in_stack_fffffffffffffc20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f8);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffc50);
      in_stack_fffffffffffffc88 =
           testing::AssertionResult::failure_message((AssertionResult *)0x1503b4);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffc50,(Type)((ulong)in_stack_fffffffffffffc48 >> 0x20),
                 in_stack_fffffffffffffc40,(int)((ulong)in_stack_fffffffffffffc38 >> 0x20),
                 in_stack_fffffffffffffc30);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffca0,
                 (Message *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc20);
      testing::Message::~Message((Message *)0x150411);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x150482);
    ktxHashList_Sort(local_40);
    ktxHashList_Serialize(local_40,&local_4c,&local_48);
    local_1c = TextureWriterTestHelper<unsigned_char,_3U,_32849U>::copyImagesToTexture
                         (in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
    local_124 = 0;
    testing::internal::EqHelper::Compare<ktx_error_code_e,_ktx_error_code_e,_nullptr>
              (in_stack_fffffffffffffc38,in_stack_fffffffffffffc30,
               (ktx_error_code_e *)in_stack_fffffffffffffc28,
               (ktx_error_code_e *)in_stack_fffffffffffffc20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_120);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffc50);
      in_stack_fffffffffffffc80 =
           testing::AssertionResult::failure_message((AssertionResult *)0x150548);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffc50,(Type)((ulong)in_stack_fffffffffffffc48 >> 0x20),
                 in_stack_fffffffffffffc40,(int)((ulong)in_stack_fffffffffffffc38 >> 0x20),
                 in_stack_fffffffffffffc30);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffca0,
                 (Message *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc20);
      testing::Message::~Message((Message *)0x1505a5);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x150613);
    local_149 = TextureWriterTestHelper<unsigned_char,_3U,_32849U>::compareTexture1Images
                          ((TextureWriterTestHelper<unsigned_char,_3U,_32849U> *)
                           CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                           in_stack_fffffffffffffc90);
    local_14a = 1;
    testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
              (in_stack_fffffffffffffc38,in_stack_fffffffffffffc30,(bool *)in_stack_fffffffffffffc28
               ,(bool *)in_stack_fffffffffffffc20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_148);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffc50);
      testing::AssertionResult::failure_message((AssertionResult *)0x1506b2);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffc50,(Type)((ulong)in_stack_fffffffffffffc48 >> 0x20),
                 in_stack_fffffffffffffc40,(int)((ulong)in_stack_fffffffffffffc38 >> 0x20),
                 in_stack_fffffffffffffc30);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffca0,
                 (Message *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc20);
      testing::Message::~Message((Message *)0x15070f);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x15077d);
    local_1c = ktxTexture1_WriteKTX2ToMemory(local_18,&local_28,local_30);
    local_171 = local_1c == 0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffffc20,(bool *)in_stack_fffffffffffffc18,
               (type *)0x1507ce);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_170);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffc50);
      testing::Message::operator<<((Message *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
      in_stack_fffffffffffffc68 =
           (WriterTestHelper<unsigned_char,_3U,_32849U> *)ktxErrorString(local_1c);
      local_188 = in_stack_fffffffffffffc68;
      in_stack_fffffffffffffc60 =
           (TextureWriterTestHelper<unsigned_char,_3U,_32849U> *)
           testing::Message::operator<<
                     ((Message *)in_stack_fffffffffffffc20,(char **)in_stack_fffffffffffffc18);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                 (char *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                 in_stack_fffffffffffffc80);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffc50,(Type)((ulong)in_stack_fffffffffffffc48 >> 0x20),
                 in_stack_fffffffffffffc40,(int)((ulong)in_stack_fffffffffffffc38 >> 0x20),
                 in_stack_fffffffffffffc30);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffca0,
                 (Message *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc20);
      std::__cxx11::string::~string(local_1b0);
      testing::Message::~Message((Message *)0x1508f2);
    }
    local_dc = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x15099f);
    if (local_dc == 0) {
      local_1b8 = local_28;
      local_1cc = memcmp(local_28,(anonymous_namespace)::ktxId2,0xc);
      local_1d0 = 0;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                (in_stack_fffffffffffffc38,in_stack_fffffffffffffc30,
                 (int *)in_stack_fffffffffffffc28,(int *)in_stack_fffffffffffffc20);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1c8);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffc50);
        in_stack_fffffffffffffc58 =
             (ktxTexture1 *)testing::AssertionResult::failure_message((AssertionResult *)0x150a5d);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffc50,(Type)((ulong)in_stack_fffffffffffffc48 >> 0x20),
                   in_stack_fffffffffffffc40,(int)((ulong)in_stack_fffffffffffffc38 >> 0x20),
                   in_stack_fffffffffffffc30);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffca0,
                   (Message *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc20);
        testing::Message::~Message((Message *)0x150aba);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x150b2b);
      local_1f1 = WriterTestHelper<unsigned_char,_3U,_32849U>::texinfo::compare
                            (in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
      local_1f2 = 1;
      testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
                (in_stack_fffffffffffffc38,in_stack_fffffffffffffc30,
                 (bool *)in_stack_fffffffffffffc28,(bool *)in_stack_fffffffffffffc20);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1f0);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffc50);
        in_stack_fffffffffffffc50 =
             (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x150bcd);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffc50,(Type)((ulong)in_stack_fffffffffffffc48 >> 0x20),
                   in_stack_fffffffffffffc40,(int)((ulong)in_stack_fffffffffffffc38 >> 0x20),
                   in_stack_fffffffffffffc30);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffca0,
                   (Message *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc20);
        testing::Message::~Message((Message *)0x150c2a);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x150c9b);
      local_210 = (uint *)vk2dfd(*(undefined4 *)((long)local_1b8 + 0xc));
      local_224 = memcmp((void *)((long)local_28 + (ulong)*(uint *)((long)local_1b8 + 0x30)),
                         local_210,(ulong)*local_210);
      local_228 = 0;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                (in_stack_fffffffffffffc38,in_stack_fffffffffffffc30,
                 (int *)in_stack_fffffffffffffc28,(int *)in_stack_fffffffffffffc20);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_220);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffc50);
        in_stack_fffffffffffffc48 =
             testing::AssertionResult::failure_message((AssertionResult *)0x150d65);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffc50,(Type)((ulong)in_stack_fffffffffffffc48 >> 0x20),
                   in_stack_fffffffffffffc40,(int)((ulong)in_stack_fffffffffffffc38 >> 0x20),
                   in_stack_fffffffffffffc30);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffca0,
                   (Message *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc20);
        testing::Message::~Message((Message *)0x150dc2);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x150e30);
      local_38 = (void *)((long)local_28 + (ulong)*(uint *)((long)local_1b8 + 0x38));
      testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                (in_stack_fffffffffffffc38,in_stack_fffffffffffffc30,
                 (uint *)in_stack_fffffffffffffc28,(uint *)in_stack_fffffffffffffc20);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_248);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffc50);
        in_stack_fffffffffffffc40 =
             testing::AssertionResult::failure_message((AssertionResult *)0x150ec7);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffc50,(Type)((ulong)in_stack_fffffffffffffc48 >> 0x20),
                   in_stack_fffffffffffffc40,(int)((ulong)in_stack_fffffffffffffc38 >> 0x20),
                   in_stack_fffffffffffffc30);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffca0,
                   (Message *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc20);
        testing::Message::~Message((Message *)0x150f24);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x150f95);
      local_26c = memcmp(local_38,local_48,(ulong)local_4c);
      local_270 = 0;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                (in_stack_fffffffffffffc38,in_stack_fffffffffffffc30,
                 (int *)in_stack_fffffffffffffc28,(int *)in_stack_fffffffffffffc20);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_268);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffc50);
        in_stack_fffffffffffffc38 =
             testing::AssertionResult::failure_message((AssertionResult *)0x151036);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffc50,(Type)((ulong)in_stack_fffffffffffffc48 >> 0x20),
                   in_stack_fffffffffffffc40,(int)((ulong)in_stack_fffffffffffffc38 >> 0x20),
                   in_stack_fffffffffffffc30);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffca0,
                   (Message *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc20);
        testing::Message::~Message((Message *)0x151093);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x151104);
      local_38 = (void *)((long)local_38 + (ulong)local_4c);
      local_288 = (long)local_28 + 0x50;
      local_290 = 0xffffffffffffffff;
      for (local_294 = 0; type = (Type)((ulong)in_stack_fffffffffffffc48 >> 0x20),
          local_294 < *(uint *)(in_RDI + 0x10); local_294 = local_294 + 1) {
        local_2a0 = *(ulong *)(local_288 + (ulong)local_294 * 0x18);
        local_2b8 = local_2a0 % (ulong)*(uint *)(in_RDI + 0x180);
        local_2bc = 0;
        testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
                  (in_stack_fffffffffffffc38,in_stack_fffffffffffffc30,
                   (unsigned_long *)in_stack_fffffffffffffc28,(uint *)in_stack_fffffffffffffc20);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2b0);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffc50);
          in_stack_fffffffffffffc30 =
               testing::AssertionResult::failure_message((AssertionResult *)0x151223);
          testing::internal::AssertHelper::AssertHelper
                    (in_stack_fffffffffffffc50,(Type)((ulong)in_stack_fffffffffffffc48 >> 0x20),
                     in_stack_fffffffffffffc40,(int)((ulong)in_stack_fffffffffffffc38 >> 0x20),
                     in_stack_fffffffffffffc30);
          testing::internal::AssertHelper::operator=
                    (in_stack_fffffffffffffca0,
                     (Message *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc20);
          testing::Message::~Message((Message *)0x151280);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x1512ee);
        testing::internal::CmpHelperLE<unsigned_long,unsigned_long>
                  (in_stack_fffffffffffffc38,in_stack_fffffffffffffc30,
                   (unsigned_long *)in_stack_fffffffffffffc28,
                   (unsigned_long *)in_stack_fffffffffffffc20);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2e0);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffc50);
          in_stack_fffffffffffffc28 =
               (texinfo *)testing::AssertionResult::failure_message((AssertionResult *)0x15135f);
          testing::internal::AssertHelper::AssertHelper
                    (in_stack_fffffffffffffc50,(Type)((ulong)in_stack_fffffffffffffc48 >> 0x20),
                     in_stack_fffffffffffffc40,(int)((ulong)in_stack_fffffffffffffc38 >> 0x20),
                     in_stack_fffffffffffffc30);
          testing::internal::AssertHelper::operator=
                    (in_stack_fffffffffffffca0,
                     (Message *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc20);
          testing::Message::~Message((Message *)0x1513bc);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x151427);
        local_290 = local_2a0;
      }
      WriterTestHelper<unsigned_char,_3U,_32849U>::compareRawImages
                (in_stack_fffffffffffffc68,(ktxLevelIndexEntry *)in_stack_fffffffffffffc60,
                 (ktx_uint8_t *)in_stack_fffffffffffffc58);
      testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
                (in_stack_fffffffffffffc38,in_stack_fffffffffffffc30,
                 (bool *)in_stack_fffffffffffffc28,(bool *)in_stack_fffffffffffffc20);
      line = (int)((ulong)in_stack_fffffffffffffc38 >> 0x20);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_300);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffc50);
        pAVar6 = (AssertHelper *)
                 testing::AssertionResult::failure_message((AssertionResult *)0x1514f0);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffc50,type,in_stack_fffffffffffffc40,line,
                   in_stack_fffffffffffffc30);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffca0,
                   (Message *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
        testing::internal::AssertHelper::~AssertHelper(pAVar6);
        testing::Message::~Message((Message *)0x15154d);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x1515bb);
      if (local_28 != (void *)0x0) {
        operator_delete(local_28,1);
      }
      (*(code *)**(undefined8 **)(local_18 + 8))(local_18);
    }
  }
  return;
}

Assistant:

void runTest(bool writeOrientationMeta, bool writeWriterMeta = true) {
        ktxTexture1* texture = 0;
        KTX_error_code result;
        ktx_uint8_t* ktxMemFile;
        ktx_size_t ktxMemFileLen;
        ktx_uint8_t* filePtr;
        ktxHashList* hl;
        ktxHashList_Create(&hl);
        ktx_uint8_t* kvData;
        ktx_uint32_t kvDataLen;

        result = ktxTexture1_Create(&helper.createInfo,
                                   KTX_TEXTURE_CREATE_ALLOC_STORAGE,
                                   &texture);
        EXPECT_EQ(result, KTX_SUCCESS);
        ASSERT_TRUE(texture != NULL) << "ktxTexture1_Create failed: "
                                     << ktxErrorString(result);

        if (writeOrientationMeta) {
            // Reminder: this is for the KTX 1 texture we have just created.
            ktxHashList_AddKVPair(&texture->kvDataHead, KTX_ORIENTATION_KEY,
                                  (unsigned int)strlen(helper.orientation) + 1,
                                  helper.orientation);
            // This is for the comparison metadata.
            ktxHashList_AddKVPair(hl, KTX_ORIENTATION_KEY,
                                  (unsigned int)strlen(helper.orientation_ktx2) + 1,
                                  helper.orientation_ktx2);
        }
        // N.B. Writer metadata is not legal in a KTX v1 file but we know
        // we're going to write this out as a v2 file so okay.
        if (writeWriterMeta) {
            ktxHashList_AddKVPair(&texture->kvDataHead, KTX_WRITER_KEY,
                                  (uint32_t)helper.writer_ktx2.size(),
                                  helper.writer_ktx2.data());
            ktxHashList_AddKVPair(hl, KTX_WRITER_KEY,
                                  (uint32_t)helper.writer_ktx2.size(),
                                  helper.writer_ktx2.data());
        }
        // Now update the comparison metadata by doing the things WriteKTX2 is
        // supposed to do so we can check it's actually doing it..
        ktxHashListEntry* pWriter = nullptr;;
        ktxHashList_FindEntry(hl, KTX_WRITER_KEY, &pWriter);
        result = appendLibId(hl, pWriter);
        EXPECT_EQ(result, KTX_SUCCESS);
        ktxHashList_Sort(hl);
        // And retrieve the comparison metadata.
        ktxHashList_Serialize(hl, &kvDataLen, &kvData);

        result = helper.copyImagesToTexture(texture);
        EXPECT_EQ(result, KTX_SUCCESS);

        EXPECT_EQ(helper.compareTexture1Images(texture->pData), true);

        result = ktxTexture1_WriteKTX2ToMemory(texture,
                                               &ktxMemFile,
                                               &ktxMemFileLen);

        ASSERT_TRUE(result == KTX_SUCCESS) << "ktxTexture_WriteKTX2ToMemory failed: "
                                           << ktxErrorString(result);

        KTX_header2* header = (KTX_header2*)ktxMemFile;

        EXPECT_EQ(memcmp(header, ktxId2, sizeof(ktxId2)), 0);
        EXPECT_EQ(helper.texinfo.compare(header), true);

        // Check the format descriptor.
        // This uses the same code to generate the comparator DFD as the
        // code under test. However we have separate tests for the
        // generator, so can be reasonably confident in it. This test
        // ensures there is a DFD in the file.
        ktx_uint32_t* dfd = vk2dfd(static_cast<VkFormat>(header->vkFormat));
        EXPECT_EQ(memcmp(ktxMemFile + header->dataFormatDescriptor.byteOffset,
                         dfd,
                         *dfd), 0);

        // Check the metadata.
        filePtr = ktxMemFile + header->keyValueData.byteOffset;
        EXPECT_EQ(header->keyValueData.byteLength, kvDataLen);
        EXPECT_EQ(memcmp(filePtr, kvData, kvDataLen), 0);
        filePtr += kvDataLen;

#if 0
        if (writeOrientationMeta) {
            EXPECT_EQ(header->keyValueData.byteLength,
                      helper.kvDataLenAll_ktx2);
            EXPECT_EQ(memcmp(filePtr, helper.kvDataAll_ktx2,
                             helper.kvDataLenAll_ktx2), 0);
            filePtr += helper.kvDataLenAll_ktx2;
        } else {
            EXPECT_EQ(header->keyValueData.byteLength,
                      helper.kvDataLenWriter_ktx2);
            EXPECT_EQ(memcmp(filePtr, helper.kvDataWriter_ktx2,
                             helper.kvDataLenWriter_ktx2), 0);
            filePtr += helper.kvDataLenWriter_ktx2;
        }
#endif
        // Offset of level 0 is first item in leveIndex after header.
        ktxLevelIndexEntry* levelIndex =
            reinterpret_cast<ktxLevelIndexEntry*>(ktxMemFile + sizeof(*header));

        ktx_uint64_t prevOffset = UINT64_MAX;
        for (ktx_uint32_t level = 0; level < helper.numLevels; level++) {
            ktx_uint64_t levelOffset = levelIndex[level].byteOffset;
            // Check offset is properly aligned.
            EXPECT_EQ(levelOffset % requiredLevelAlignment, 0U);
            // Check mipmaps are in order of increasing size in the file
            // therefore each offset should be smaller than the previous.
            EXPECT_LE(levelOffset, prevOffset);
            prevOffset = levelOffset;
        }

        EXPECT_EQ(helper.compareRawImages(levelIndex, ktxMemFile), true);
        delete ktxMemFile;
        ktxTexture_Destroy(ktxTexture(texture));
    }